

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRGBA.hpp
# Opt level: O1

Vec4 __thiscall tcu::RGBA::toVec(RGBA *this)

{
  uint uVar1;
  uint *in_RSI;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  Vec4 VVar2;
  
  uVar1 = *in_RSI;
  VVar2.m_data[1] = (undefined4)((ulong)in_XMM0_Qa >> 0x20);
  VVar2.m_data[3] = (undefined4)((ulong)in_XMM1_Qa >> 0x20);
  VVar2.m_data[0] = (float)(uVar1 & 0xff) / 255.0;
  VVar2.m_data[2] = (float)(uVar1 >> 8 & 0xff) / 255.0;
  this->m_value = (deUint32)VVar2.m_data[0];
  this[1].m_value = (deUint32)VVar2.m_data[2];
  this[2].m_value = (deUint32)((float)(uVar1 >> 0x10 & 0xff) / 255.0);
  this[3].m_value = (deUint32)((float)(uVar1 >> 0x18) / 255.0);
  return (Vec4)VVar2.m_data;
}

Assistant:

int			getAlpha				(void) const { return (int)((m_value >> (deUint32)ALPHA_SHIFT) & 0xFFu); }